

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O1

void fadst8x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  __m128i alVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  __m128i alVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  
  uVar5 = (uint)CONCAT71(in_register_00000011,cos_bit);
  auVar9 = ZEXT416(uVar5);
  iVar1 = 1 << (cos_bit - 1U & 0x1f);
  lVar3 = (long)(int)uVar5 * 0x100;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  iVar4 = (uVar5 & 0xffff) + uVar5 * 0x10000;
  auVar11._4_4_ = iVar4;
  auVar11._0_4_ = iVar4;
  auVar11._8_4_ = iVar4;
  auVar11._12_4_ = iVar4;
  iVar4 = (uVar5 & 0xffff) + uVar5 * -0x10000;
  auVar94._4_4_ = iVar4;
  auVar94._0_4_ = iVar4;
  auVar94._8_4_ = iVar4;
  auVar94._12_4_ = iVar4;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  uVar7 = uVar2 << 0x10 | uVar5 & 0xffff;
  iVar4 = (uVar2 & 0xffff) + uVar5 * -0x10000;
  auVar27._4_4_ = iVar4;
  auVar27._0_4_ = iVar4;
  auVar27._8_4_ = iVar4;
  auVar27._12_4_ = iVar4;
  auVar10 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[7]);
  auVar79 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[3]);
  auVar17 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[1]);
  auVar49 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[5]);
  auVar40._0_12_ = auVar79._0_12_;
  auVar40._12_2_ = auVar79._6_2_;
  auVar40._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar79._0_10_;
  auVar39._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar79._0_8_;
  auVar38._8_2_ = auVar79._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar37._4_2_ = auVar79._2_2_;
  auVar37._0_2_ = auVar79._0_2_;
  auVar37._2_2_ = (short)input[4][0];
  auVar80._2_2_ = (short)input[4][1];
  auVar80._0_2_ = auVar79._8_2_;
  auVar80._4_2_ = auVar79._10_2_;
  auVar80._6_2_ = *(undefined2 *)((long)input[4] + 10);
  auVar80._8_2_ = auVar79._12_2_;
  auVar80._10_2_ = *(undefined2 *)((long)input[4] + 0xc);
  auVar80._12_2_ = auVar79._14_2_;
  auVar80._14_2_ = *(undefined2 *)((long)input[4] + 0xe);
  auVar56 = pmaddwd(auVar37,auVar11);
  auVar65 = pmaddwd(auVar80,auVar11);
  auVar79 = pmaddwd(auVar37,auVar94);
  auVar81 = pmaddwd(auVar80,auVar94);
  auVar57._0_4_ = auVar56._0_4_ + iVar1 >> auVar9;
  auVar57._4_4_ = auVar56._4_4_ + iVar1 >> auVar9;
  auVar57._8_4_ = auVar56._8_4_ + iVar1 >> auVar9;
  auVar57._12_4_ = auVar56._12_4_ + iVar1 >> auVar9;
  auVar66._0_4_ = auVar65._0_4_ + iVar1 >> auVar9;
  auVar66._4_4_ = auVar65._4_4_ + iVar1 >> auVar9;
  auVar66._8_4_ = auVar65._8_4_ + iVar1 >> auVar9;
  auVar66._12_4_ = auVar65._12_4_ + iVar1 >> auVar9;
  auVar65 = packssdw(auVar57,auVar66);
  auVar41._0_4_ = auVar79._0_4_ + iVar1 >> auVar9;
  auVar41._4_4_ = auVar79._4_4_ + iVar1 >> auVar9;
  auVar41._8_4_ = auVar79._8_4_ + iVar1 >> auVar9;
  auVar41._12_4_ = auVar79._12_4_ + iVar1 >> auVar9;
  auVar82._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar82._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar82._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar82._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  alVar64 = input[2];
  auVar56 = packssdw(auVar41,auVar82);
  auVar86._0_12_ = alVar64._0_12_;
  auVar86._12_2_ = alVar64[0]._6_2_;
  auVar86._14_2_ = auVar49._6_2_;
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._0_10_ = alVar64._0_10_;
  auVar85._10_2_ = auVar49._4_2_;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._0_8_ = alVar64[0];
  auVar84._8_2_ = alVar64[0]._4_2_;
  auVar83._8_8_ = auVar84._8_8_;
  auVar83._6_2_ = auVar49._2_2_;
  auVar83._4_2_ = alVar64[0]._2_2_;
  auVar83._0_2_ = (undefined2)alVar64[0];
  auVar83._2_2_ = auVar49._0_2_;
  auVar67._2_2_ = auVar49._8_2_;
  auVar67._0_2_ = (short)alVar64[1];
  auVar67._4_2_ = alVar64[1]._2_2_;
  auVar67._6_2_ = auVar49._10_2_;
  auVar67._8_2_ = alVar64[1]._4_2_;
  auVar67._10_2_ = auVar49._12_2_;
  auVar67._12_2_ = alVar64[1]._6_2_;
  auVar67._14_2_ = auVar49._14_2_;
  auVar49 = pmaddwd(auVar83,auVar11);
  auVar11 = pmaddwd(auVar11,auVar67);
  auVar81 = pmaddwd(auVar83,auVar94);
  auVar79 = pmaddwd(auVar67,auVar94);
  auVar93._0_4_ = auVar49._0_4_ + iVar1 >> auVar9;
  auVar93._4_4_ = auVar49._4_4_ + iVar1 >> auVar9;
  auVar93._8_4_ = auVar49._8_4_ + iVar1 >> auVar9;
  auVar93._12_4_ = auVar49._12_4_ + iVar1 >> auVar9;
  auVar49._0_4_ = auVar11._0_4_ + iVar1 >> auVar9;
  auVar49._4_4_ = auVar11._4_4_ + iVar1 >> auVar9;
  auVar49._8_4_ = auVar11._8_4_ + iVar1 >> auVar9;
  auVar49._12_4_ = auVar11._12_4_ + iVar1 >> auVar9;
  auVar94 = packssdw(auVar93,auVar49);
  auVar87._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar87._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar87._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar87._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  auVar68._0_4_ = auVar79._0_4_ + iVar1 >> auVar9;
  auVar68._4_4_ = auVar79._4_4_ + iVar1 >> auVar9;
  auVar68._8_4_ = auVar79._8_4_ + iVar1 >> auVar9;
  auVar68._12_4_ = auVar79._12_4_ + iVar1 >> auVar9;
  auVar88 = packssdw(auVar87,auVar68);
  auVar79 = paddsw((undefined1  [16])*input,auVar65);
  auVar11 = psubsw((undefined1  [16])*input,auVar65);
  auVar49 = paddsw(auVar10,auVar56);
  auVar10 = psubsw(auVar10,auVar56);
  auVar81 = paddsw(auVar17,auVar94);
  auVar17 = psubsw(auVar17,auVar94);
  auVar56 = paddsw((undefined1  [16])input[6],auVar88);
  auVar65 = psubsw((undefined1  [16])input[6],auVar88);
  auVar45._0_12_ = auVar81._0_12_;
  auVar45._12_2_ = auVar81._6_2_;
  auVar45._14_2_ = auVar56._6_2_;
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._0_10_ = auVar81._0_10_;
  auVar44._10_2_ = auVar56._4_2_;
  auVar43._10_6_ = auVar44._10_6_;
  auVar43._0_8_ = auVar81._0_8_;
  auVar43._8_2_ = auVar81._4_2_;
  auVar42._8_8_ = auVar43._8_8_;
  auVar42._6_2_ = auVar56._2_2_;
  auVar42._4_2_ = auVar81._2_2_;
  auVar42._0_2_ = auVar81._0_2_;
  auVar42._2_2_ = auVar56._0_2_;
  auVar69._2_2_ = auVar56._8_2_;
  auVar69._0_2_ = auVar81._8_2_;
  auVar69._4_2_ = auVar81._10_2_;
  auVar69._6_2_ = auVar56._10_2_;
  auVar69._8_2_ = auVar81._12_2_;
  auVar69._10_2_ = auVar56._12_2_;
  auVar69._12_2_ = auVar81._14_2_;
  auVar69._14_2_ = auVar56._14_2_;
  auVar56 = pmaddwd(auVar42,auVar27);
  auVar94 = pmaddwd(auVar69,auVar27);
  auVar28._4_4_ = uVar7;
  auVar28._0_4_ = uVar7;
  auVar28._8_4_ = uVar7;
  auVar28._12_4_ = uVar7;
  auVar81 = pmaddwd(auVar42,auVar28);
  auVar88 = pmaddwd(auVar69,auVar28);
  auVar58._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar58._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar58._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar58._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  auVar89._0_4_ = auVar88._0_4_ + iVar1 >> auVar9;
  auVar89._4_4_ = auVar88._4_4_ + iVar1 >> auVar9;
  auVar89._8_4_ = auVar88._8_4_ + iVar1 >> auVar9;
  auVar89._12_4_ = auVar88._12_4_ + iVar1 >> auVar9;
  uVar5 = -uVar2 & 0xffff | uVar5 * 0x10000;
  auVar88 = packssdw(auVar58,auVar89);
  auVar90._4_4_ = uVar5;
  auVar90._0_4_ = uVar5;
  auVar90._8_4_ = uVar5;
  auVar90._12_4_ = uVar5;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x170);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x250);
  uVar7 = uVar2 << 0x10 | uVar5 & 0xffff;
  auVar46._0_4_ = auVar56._0_4_ + iVar1 >> auVar9;
  auVar46._4_4_ = auVar56._4_4_ + iVar1 >> auVar9;
  auVar46._8_4_ = auVar56._8_4_ + iVar1 >> auVar9;
  auVar46._12_4_ = auVar56._12_4_ + iVar1 >> auVar9;
  auVar70._0_4_ = auVar94._0_4_ + iVar1 >> auVar9;
  auVar70._4_4_ = auVar94._4_4_ + iVar1 >> auVar9;
  auVar70._8_4_ = auVar94._8_4_ + iVar1 >> auVar9;
  auVar70._12_4_ = auVar94._12_4_ + iVar1 >> auVar9;
  auVar56 = packssdw(auVar46,auVar70);
  auVar74._0_12_ = auVar17._0_12_;
  auVar74._12_2_ = auVar17._6_2_;
  auVar74._14_2_ = auVar65._6_2_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = auVar17._0_10_;
  auVar73._10_2_ = auVar65._4_2_;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._0_8_ = auVar17._0_8_;
  auVar72._8_2_ = auVar17._4_2_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = auVar65._2_2_;
  auVar71._4_2_ = auVar17._2_2_;
  auVar71._0_2_ = auVar17._0_2_;
  auVar71._2_2_ = auVar65._0_2_;
  auVar18._2_2_ = auVar65._8_2_;
  auVar18._0_2_ = auVar17._8_2_;
  auVar18._4_2_ = auVar17._10_2_;
  auVar18._6_2_ = auVar65._10_2_;
  auVar18._8_2_ = auVar17._12_2_;
  auVar18._10_2_ = auVar65._12_2_;
  auVar18._12_2_ = auVar17._14_2_;
  auVar18._14_2_ = auVar65._14_2_;
  auVar94 = pmaddwd(auVar71,auVar90);
  auVar81 = pmaddwd(auVar90,auVar18);
  auVar65 = pmaddwd(auVar71,auVar28);
  auVar17 = pmaddwd(auVar18,auVar28);
  auVar29._4_4_ = uVar7;
  auVar29._0_4_ = uVar7;
  auVar29._8_4_ = uVar7;
  auVar29._12_4_ = uVar7;
  auVar95._0_4_ = auVar94._0_4_ + iVar1 >> auVar9;
  auVar95._4_4_ = auVar94._4_4_ + iVar1 >> auVar9;
  auVar95._8_4_ = auVar94._8_4_ + iVar1 >> auVar9;
  auVar95._12_4_ = auVar94._12_4_ + iVar1 >> auVar9;
  auVar91._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar91._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar91._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar91._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  iVar4 = (uVar2 & 0xffff) + uVar5 * -0x10000;
  auVar96 = packssdw(auVar95,auVar91);
  auVar92._4_4_ = iVar4;
  auVar92._0_4_ = iVar4;
  auVar92._8_4_ = iVar4;
  auVar92._12_4_ = iVar4;
  auVar75._0_4_ = auVar65._0_4_ + iVar1 >> auVar9;
  auVar75._4_4_ = auVar65._4_4_ + iVar1 >> auVar9;
  auVar75._8_4_ = auVar65._8_4_ + iVar1 >> auVar9;
  auVar75._12_4_ = auVar65._12_4_ + iVar1 >> auVar9;
  auVar19._0_4_ = auVar17._0_4_ + iVar1 >> auVar9;
  auVar19._4_4_ = auVar17._4_4_ + iVar1 >> auVar9;
  auVar19._8_4_ = auVar17._8_4_ + iVar1 >> auVar9;
  auVar19._12_4_ = auVar17._12_4_ + iVar1 >> auVar9;
  auVar94 = packssdw(auVar75,auVar19);
  auVar81 = paddsw(auVar79,auVar88);
  auVar17 = psubsw(auVar79,auVar88);
  auVar88 = paddsw(auVar49,auVar56);
  auVar49 = psubsw(auVar49,auVar56);
  auVar56 = paddsw(auVar11,auVar96);
  auVar11 = psubsw(auVar11,auVar96);
  auVar65 = paddsw(auVar10,auVar94);
  auVar79 = psubsw(auVar10,auVar94);
  auVar62._0_12_ = auVar81._0_12_;
  auVar62._12_2_ = auVar81._6_2_;
  auVar62._14_2_ = auVar88._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._0_10_ = auVar81._0_10_;
  auVar61._10_2_ = auVar88._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_8_ = auVar81._0_8_;
  auVar60._8_2_ = auVar81._4_2_;
  auVar59._8_8_ = auVar60._8_8_;
  auVar59._6_2_ = auVar88._2_2_;
  auVar59._4_2_ = auVar81._2_2_;
  auVar59._0_2_ = auVar81._0_2_;
  auVar59._2_2_ = auVar88._0_2_;
  auVar50._2_2_ = auVar88._8_2_;
  auVar50._0_2_ = auVar81._8_2_;
  auVar50._4_2_ = auVar81._10_2_;
  auVar50._6_2_ = auVar88._10_2_;
  auVar50._8_2_ = auVar81._12_2_;
  auVar50._10_2_ = auVar88._12_2_;
  auVar50._12_2_ = auVar81._14_2_;
  auVar50._14_2_ = auVar88._14_2_;
  auVar88 = pmaddwd(auVar59,auVar29);
  auVar10 = pmaddwd(auVar29,auVar50);
  auVar81 = pmaddwd(auVar59,auVar92);
  auVar76._0_4_ = auVar88._0_4_ + iVar1 >> auVar9;
  auVar76._4_4_ = auVar88._4_4_ + iVar1 >> auVar9;
  auVar76._8_4_ = auVar88._8_4_ + iVar1 >> auVar9;
  auVar76._12_4_ = auVar88._12_4_ + iVar1 >> auVar9;
  auVar30._0_4_ = auVar10._0_4_ + iVar1 >> auVar9;
  auVar30._4_4_ = auVar10._4_4_ + iVar1 >> auVar9;
  auVar30._8_4_ = auVar10._8_4_ + iVar1 >> auVar9;
  auVar30._12_4_ = auVar10._12_4_ + iVar1 >> auVar9;
  auVar10 = pmaddwd(auVar50,auVar92);
  alVar77 = (__m128i)packssdw(auVar76,auVar30);
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 400);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x1b0);
  uVar7 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x210);
  auVar63._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar63._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar63._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar63._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  auVar51._0_4_ = auVar10._0_4_ + iVar1 >> auVar9;
  auVar51._4_4_ = auVar10._4_4_ + iVar1 >> auVar9;
  auVar51._8_4_ = auVar10._8_4_ + iVar1 >> auVar9;
  auVar51._12_4_ = auVar10._12_4_ + iVar1 >> auVar9;
  uVar8 = uVar7 << 0x10 | uVar2 & 0xffff;
  alVar64 = (__m128i)packssdw(auVar63,auVar51);
  auVar52._4_4_ = uVar8;
  auVar52._0_4_ = uVar8;
  auVar52._8_4_ = uVar8;
  auVar52._12_4_ = uVar8;
  iVar4 = (uVar7 & 0xffff) + uVar2 * -0x10000;
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x1f0);
  uVar7 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x1d0);
  uVar8 = *(uint *)((long)vert_filter_length_chroma + lVar3 + 0x230);
  output[7] = alVar77;
  auVar78._4_4_ = iVar4;
  auVar78._0_4_ = iVar4;
  auVar78._8_4_ = iVar4;
  auVar78._12_4_ = iVar4;
  *output = alVar64;
  auVar34._0_12_ = auVar56._0_12_;
  auVar34._12_2_ = auVar56._6_2_;
  auVar34._14_2_ = auVar65._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar56._0_10_;
  auVar33._10_2_ = auVar65._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar56._0_8_;
  auVar32._8_2_ = auVar56._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = auVar65._2_2_;
  auVar31._4_2_ = auVar56._2_2_;
  auVar31._0_2_ = auVar56._0_2_;
  auVar31._2_2_ = auVar65._0_2_;
  auVar20._2_2_ = auVar65._8_2_;
  auVar20._0_2_ = auVar56._8_2_;
  auVar20._4_2_ = auVar56._10_2_;
  auVar20._6_2_ = auVar65._10_2_;
  auVar20._8_2_ = auVar56._12_2_;
  auVar20._10_2_ = auVar65._12_2_;
  auVar20._12_2_ = auVar56._14_2_;
  auVar20._14_2_ = auVar65._14_2_;
  auVar65 = pmaddwd(auVar31,auVar52);
  auVar81 = pmaddwd(auVar52,auVar20);
  auVar56 = pmaddwd(auVar31,auVar78);
  auVar10 = pmaddwd(auVar20,auVar78);
  auVar47._0_4_ = auVar65._0_4_ + iVar1 >> auVar9;
  auVar47._4_4_ = auVar65._4_4_ + iVar1 >> auVar9;
  auVar47._8_4_ = auVar65._8_4_ + iVar1 >> auVar9;
  auVar47._12_4_ = auVar65._12_4_ + iVar1 >> auVar9;
  auVar53._0_4_ = auVar81._0_4_ + iVar1 >> auVar9;
  auVar53._4_4_ = auVar81._4_4_ + iVar1 >> auVar9;
  auVar53._8_4_ = auVar81._8_4_ + iVar1 >> auVar9;
  auVar53._12_4_ = auVar81._12_4_ + iVar1 >> auVar9;
  alVar77 = (__m128i)packssdw(auVar47,auVar53);
  uVar6 = uVar7 << 0x10 | uVar2 & 0xffff;
  auVar35._0_4_ = auVar56._0_4_ + iVar1 >> auVar9;
  auVar35._4_4_ = auVar56._4_4_ + iVar1 >> auVar9;
  auVar35._8_4_ = auVar56._8_4_ + iVar1 >> auVar9;
  auVar35._12_4_ = auVar56._12_4_ + iVar1 >> auVar9;
  auVar21._0_4_ = auVar10._0_4_ + iVar1 >> auVar9;
  auVar21._4_4_ = auVar10._4_4_ + iVar1 >> auVar9;
  auVar21._8_4_ = auVar10._8_4_ + iVar1 >> auVar9;
  auVar21._12_4_ = auVar10._12_4_ + iVar1 >> auVar9;
  alVar64 = (__m128i)packssdw(auVar35,auVar21);
  auVar54._4_4_ = uVar6;
  auVar54._0_4_ = uVar6;
  auVar54._8_4_ = uVar6;
  auVar54._12_4_ = uVar6;
  iVar4 = (uVar7 & 0xffff) + uVar2 * -0x10000;
  output[5] = alVar77;
  auVar48._4_4_ = iVar4;
  auVar48._0_4_ = iVar4;
  auVar48._8_4_ = iVar4;
  auVar48._12_4_ = iVar4;
  output[2] = alVar64;
  auVar25._0_12_ = auVar17._0_12_;
  auVar25._12_2_ = auVar17._6_2_;
  auVar25._14_2_ = auVar49._6_2_;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar17._0_10_;
  auVar24._10_2_ = auVar49._4_2_;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = auVar17._0_8_;
  auVar23._8_2_ = auVar17._4_2_;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = auVar49._2_2_;
  auVar22._4_2_ = auVar17._2_2_;
  auVar22._0_2_ = auVar17._0_2_;
  auVar22._2_2_ = auVar49._0_2_;
  auVar56._2_2_ = auVar49._8_2_;
  auVar56._0_2_ = auVar17._8_2_;
  auVar56._4_2_ = auVar17._10_2_;
  auVar56._6_2_ = auVar49._10_2_;
  auVar56._8_2_ = auVar17._12_2_;
  auVar56._10_2_ = auVar49._12_2_;
  auVar56._12_2_ = auVar17._14_2_;
  auVar56._14_2_ = auVar49._14_2_;
  auVar17 = pmaddwd(auVar22,auVar54);
  auVar65 = pmaddwd(auVar54,auVar56);
  auVar49 = pmaddwd(auVar22,auVar48);
  auVar10 = pmaddwd(auVar56,auVar48);
  auVar96._0_4_ = auVar17._0_4_ + iVar1 >> auVar9;
  auVar96._4_4_ = auVar17._4_4_ + iVar1 >> auVar9;
  auVar96._8_4_ = auVar17._8_4_ + iVar1 >> auVar9;
  auVar96._12_4_ = auVar17._12_4_ + iVar1 >> auVar9;
  auVar55._0_4_ = auVar65._0_4_ + iVar1 >> auVar9;
  auVar55._4_4_ = auVar65._4_4_ + iVar1 >> auVar9;
  auVar55._8_4_ = auVar65._8_4_ + iVar1 >> auVar9;
  auVar55._12_4_ = auVar65._12_4_ + iVar1 >> auVar9;
  alVar64 = (__m128i)packssdw(auVar96,auVar55);
  uVar2 = uVar5 << 0x10 | uVar8 & 0xffff;
  auVar26._0_4_ = auVar49._0_4_ + iVar1 >> auVar9;
  auVar26._4_4_ = auVar49._4_4_ + iVar1 >> auVar9;
  auVar26._8_4_ = auVar49._8_4_ + iVar1 >> auVar9;
  auVar26._12_4_ = auVar49._12_4_ + iVar1 >> auVar9;
  auVar65._0_4_ = auVar10._0_4_ + iVar1 >> auVar9;
  auVar65._4_4_ = auVar10._4_4_ + iVar1 >> auVar9;
  auVar65._8_4_ = auVar10._8_4_ + iVar1 >> auVar9;
  auVar65._12_4_ = auVar10._12_4_ + iVar1 >> auVar9;
  alVar77 = (__m128i)packssdw(auVar26,auVar65);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  iVar4 = (uVar5 & 0xffff) + uVar8 * -0x10000;
  output[3] = alVar64;
  auVar36._4_4_ = iVar4;
  auVar36._0_4_ = iVar4;
  auVar36._8_4_ = iVar4;
  auVar36._12_4_ = iVar4;
  output[4] = alVar77;
  auVar15._0_12_ = auVar11._0_12_;
  auVar15._12_2_ = auVar11._6_2_;
  auVar15._14_2_ = auVar79._6_2_;
  auVar14._12_4_ = auVar15._12_4_;
  auVar14._0_10_ = auVar11._0_10_;
  auVar14._10_2_ = auVar79._4_2_;
  auVar13._10_6_ = auVar14._10_6_;
  auVar13._0_8_ = auVar11._0_8_;
  auVar13._8_2_ = auVar11._4_2_;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._6_2_ = auVar79._2_2_;
  auVar12._4_2_ = auVar11._2_2_;
  auVar12._0_2_ = auVar11._0_2_;
  auVar12._2_2_ = auVar79._0_2_;
  auVar10._2_2_ = auVar79._8_2_;
  auVar10._0_2_ = auVar11._8_2_;
  auVar10._4_2_ = auVar11._10_2_;
  auVar10._6_2_ = auVar79._10_2_;
  auVar10._8_2_ = auVar11._12_2_;
  auVar10._10_2_ = auVar79._12_2_;
  auVar10._12_2_ = auVar11._14_2_;
  auVar10._14_2_ = auVar79._14_2_;
  auVar79 = pmaddwd(auVar12,auVar81);
  auVar49 = pmaddwd(auVar81,auVar10);
  auVar56 = pmaddwd(auVar12,auVar36);
  auVar11 = pmaddwd(auVar10,auVar36);
  auVar17._0_4_ = auVar79._0_4_ + iVar1 >> auVar9;
  auVar17._4_4_ = auVar79._4_4_ + iVar1 >> auVar9;
  auVar17._8_4_ = auVar79._8_4_ + iVar1 >> auVar9;
  auVar17._12_4_ = auVar79._12_4_ + iVar1 >> auVar9;
  auVar88._0_4_ = auVar49._0_4_ + iVar1 >> auVar9;
  auVar88._4_4_ = auVar49._4_4_ + iVar1 >> auVar9;
  auVar88._8_4_ = auVar49._8_4_ + iVar1 >> auVar9;
  auVar88._12_4_ = auVar49._12_4_ + iVar1 >> auVar9;
  auVar16._0_4_ = auVar56._0_4_ + iVar1 >> auVar9;
  auVar16._4_4_ = auVar56._4_4_ + iVar1 >> auVar9;
  auVar16._8_4_ = auVar56._8_4_ + iVar1 >> auVar9;
  auVar16._12_4_ = auVar56._12_4_ + iVar1 >> auVar9;
  auVar79._0_4_ = auVar11._0_4_ + iVar1 >> auVar9;
  auVar79._4_4_ = auVar11._4_4_ + iVar1 >> auVar9;
  auVar79._8_4_ = auVar11._8_4_ + iVar1 >> auVar9;
  auVar79._12_4_ = auVar11._12_4_ + iVar1 >> auVar9;
  alVar64 = (__m128i)packssdw(auVar17,auVar88);
  alVar77 = (__m128i)packssdw(auVar16,auVar79);
  output[1] = alVar64;
  output[6] = alVar77;
  return;
}

Assistant:

static inline void fadst8x8_new_sse2(const __m128i *input, __m128i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m128i x1[8];
  x1[0] = input[0];
  x1[1] = _mm_subs_epi16(__zero, input[7]);
  x1[2] = _mm_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm_subs_epi16(__zero, input[5]);

  // stage 2
  __m128i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[2], x1[3], x2[2], x2[3]);
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[6], x1[7], x2[6], x2[7]);

  // stage 3
  __m128i x3[8];
  x3[0] = _mm_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m128i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[4], x3[5], x4[4], x4[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[6], x3[7], x4[6], x4[7]);

  // stage 5, 6 and 7
  output[7] = _mm_adds_epi16(x4[0], x4[4]);
  output[3] = _mm_subs_epi16(x4[0], x4[4]);
  output[0] = _mm_adds_epi16(x4[1], x4[5]);
  output[4] = _mm_subs_epi16(x4[1], x4[5]);
  output[5] = _mm_adds_epi16(x4[2], x4[6]);
  output[1] = _mm_subs_epi16(x4[2], x4[6]);
  output[2] = _mm_adds_epi16(x4[3], x4[7]);
  output[6] = _mm_subs_epi16(x4[3], x4[7]);

  btf_16_sse2(cospi_p04_p60, cospi_p60_m04, output[7], output[0], output[7],
              output[0]);
  btf_16_sse2(cospi_p20_p44, cospi_p44_m20, output[5], output[2], output[5],
              output[2]);
  btf_16_sse2(cospi_p36_p28, cospi_p28_m36, output[3], output[4], output[3],
              output[4]);
  btf_16_sse2(cospi_p52_p12, cospi_p12_m52, output[1], output[6], output[1],
              output[6]);
}